

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
* libtorrent::anon_unknown_62::read_nodes
            (vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
             *__return_storage_ptr__,stack_allocator *alloc,int v4_num_nodes,
            allocation_slot v4_nodes_idx,int v6_num_nodes,allocation_slot v6_nodes_idx)

{
  vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  *pvVar1;
  char **in;
  char **in_00;
  int iVar2;
  bool bVar3;
  char *v6_ptr;
  char *v4_ptr;
  sha1_hash ih;
  vector<std::pair<sha1_hash,_udp::endpoint>_> nodes;
  uint *local_a8;
  uint *local_a0;
  digest32<160L> local_98;
  vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  *local_78;
  stack_allocator *local_70;
  _Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  local_68;
  basic_endpoint<boost::asio::ip::udp> local_4c;
  
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  aux::
  container_wrapper<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>,int,std::vector<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>,std::allocator<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>>>>
  ::reserve<int,void>((container_wrapper<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>,int,std::vector<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>,std::allocator<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>>>>
                       *)&local_68,v6_num_nodes + v4_num_nodes);
  local_78 = __return_storage_ptr__;
  local_70 = alloc;
  local_a0 = (uint *)aux::stack_allocator::ptr(alloc,v4_nodes_idx);
  iVar2 = 0;
  if (0 < v4_num_nodes) {
    iVar2 = v4_num_nodes;
  }
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    digest32<160L>::clear(&local_98);
    local_98.m_number._M_elems._0_8_ = *(undefined8 *)local_a0;
    local_98.m_number._M_elems._8_8_ = *(undefined8 *)(local_a0 + 2);
    local_98.m_number._M_elems[4] = local_a0[4];
    local_a0 = local_a0 + 5;
    detail::read_v4_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,char_const*&>
              (&local_4c,(detail *)&local_a0,in);
    std::
    vector<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>,std::allocator<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>>>
    ::
    emplace_back<libtorrent::digest32<160l>&,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>
              ((vector<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>,std::allocator<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>>>
                *)&local_68,&local_98,&local_4c);
  }
  local_a8 = (uint *)aux::stack_allocator::ptr(local_70,v6_nodes_idx);
  iVar2 = 0;
  if (0 < v6_num_nodes) {
    iVar2 = v6_num_nodes;
  }
  while (pvVar1 = local_78, bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    digest32<160L>::clear(&local_98);
    local_98.m_number._M_elems._0_8_ = *(undefined8 *)local_a8;
    local_98.m_number._M_elems._8_8_ = *(undefined8 *)(local_a8 + 2);
    local_98.m_number._M_elems[4] = local_a8[4];
    local_a8 = local_a8 + 5;
    detail::read_v6_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,char_const*&>
              (&local_4c,(detail *)&local_a8,in_00);
    std::
    vector<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>,std::allocator<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>>>
    ::
    emplace_back<libtorrent::digest32<160l>&,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>
              ((vector<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>,std::allocator<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>>>
                *)&local_68,&local_98,&local_4c);
  }
  (local_78->
  super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = local_68._M_impl.super__Vector_impl_data._M_start;
  (local_78->
  super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = local_68._M_impl.super__Vector_impl_data._M_finish;
  (local_78->
  super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_68._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  _Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  ::~_Vector_base(&local_68);
  return pvVar1;
}

Assistant:

std::vector<std::pair<sha1_hash, udp::endpoint>> read_nodes(
		aux::stack_allocator const& alloc
		, int const v4_num_nodes, aux::allocation_slot const v4_nodes_idx
		, int const v6_num_nodes, aux::allocation_slot const v6_nodes_idx)
	{
		aux::vector<std::pair<sha1_hash, udp::endpoint>> nodes;
		nodes.reserve(v4_num_nodes + v6_num_nodes);

		char const* v4_ptr = alloc.ptr(v4_nodes_idx);
		for (int i = 0; i < v4_num_nodes; i++)
		{
			sha1_hash ih;
			std::memcpy(ih.data(), v4_ptr, 20);
			v4_ptr += 20;
			nodes.emplace_back(ih, detail::read_v4_endpoint<udp::endpoint>(v4_ptr));
		}
		char const* v6_ptr = alloc.ptr(v6_nodes_idx);
		for (int i = 0; i < v6_num_nodes; i++)
		{
			sha1_hash ih;
			std::memcpy(ih.data(), v6_ptr, 20);
			v6_ptr += 20;
			nodes.emplace_back(ih, detail::read_v6_endpoint<udp::endpoint>(v6_ptr));
		}

		return std::move(nodes);
	}